

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

void ImGui::DrawRectFilled(FloatRect *rect,Color *color,float rounding,int rounding_corners)

{
  ImU32 col;
  ImDrawList *this;
  ImVec4 local_58;
  ImVec4 local_48;
  ImVec2 local_38;
  ImVec2 local_30;
  ImDrawList *local_28;
  ImDrawList *draw_list;
  int rounding_corners_local;
  float rounding_local;
  Color *color_local;
  FloatRect *rect_local;
  
  draw_list._0_4_ = rounding_corners;
  draw_list._4_4_ = rounding;
  _rounding_corners_local = color;
  color_local = (Color *)rect;
  this = GetWindowDrawList();
  local_28 = this;
  local_30 = anon_unknown.dwarf_f6bf2::getTopLeftAbsolute((FloatRect *)color_local);
  local_38 = anon_unknown.dwarf_f6bf2::getDownRightAbsolute((FloatRect *)color_local);
  local_58 = (ImVec4)anon_unknown.dwarf_f6bf2::toImColor(*_rounding_corners_local);
  local_48 = ImColor::operator_cast_to_ImVec4((ImColor *)&local_58);
  col = ColorConvertFloat4ToU32(&local_48);
  ImDrawList::AddRectFilled(this,&local_30,&local_38,col,draw_list._4_4_,(int)draw_list);
  return;
}

Assistant:

void DrawRectFilled(const sf::FloatRect& rect, const sf::Color& color, float rounding,
                    int rounding_corners) {
    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    draw_list->AddRectFilled(getTopLeftAbsolute(rect), getDownRightAbsolute(rect),
                             ColorConvertFloat4ToU32(toImColor(color)), rounding, rounding_corners);
}